

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggressive_dead_code_elim_pass.cpp
# Opt level: O0

void __thiscall
spvtools::opt::AggressiveDCEPass::ProcessWorkList(AggressiveDCEPass *this,Function *func)

{
  Instruction *inst;
  bool bVar1;
  reference ppIVar2;
  Instruction *live_inst;
  Function *func_local;
  AggressiveDCEPass *this_local;
  
  while( true ) {
    bVar1 = std::
            queue<spvtools::opt::Instruction_*,_std::deque<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
            ::empty(&this->worklist_);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    ppIVar2 = std::
              queue<spvtools::opt::Instruction_*,_std::deque<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
              ::front(&this->worklist_);
    inst = *ppIVar2;
    std::
    queue<spvtools::opt::Instruction_*,_std::deque<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
    ::pop(&this->worklist_);
    AddOperandsToWorkList(this,inst);
    MarkBlockAsLive(this,inst);
    MarkLoadedVariablesAsLive(this,func,inst);
    AddDecorationsToWorkList(this,inst);
    AddDebugInstructionsToWorkList(this,inst);
  }
  return;
}

Assistant:

void AggressiveDCEPass::ProcessWorkList(Function* func) {
  while (!worklist_.empty()) {
    Instruction* live_inst = worklist_.front();
    worklist_.pop();
    AddOperandsToWorkList(live_inst);
    MarkBlockAsLive(live_inst);
    MarkLoadedVariablesAsLive(func, live_inst);
    AddDecorationsToWorkList(live_inst);
    AddDebugInstructionsToWorkList(live_inst);
  }
}